

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memplumber.cpp
# Opt level: O0

void __thiscall
MemPlumberInternal::staticMemAllocation
          (MemPlumberInternal *this,size_t *memCount,uint64_t *memSize,bool verbose,
          char *fileDumperName,bool append)

{
  new_ptr_list_t *local_50;
  new_ptr_list_t *metaDataBucketLinkedListElement;
  FILE *pFStack_40;
  int index;
  FILE *dumper;
  bool append_local;
  char *fileDumperName_local;
  bool verbose_local;
  uint64_t *memSize_local;
  size_t *memCount_local;
  MemPlumberInternal *this_local;
  
  *memCount = 0;
  *memSize = 0;
  pFStack_40 = (FILE *)0x0;
  if (verbose) {
    pFStack_40 = (FILE *)openFile(this,fileDumperName,append);
  }
  for (metaDataBucketLinkedListElement._4_4_ = 0; metaDataBucketLinkedListElement._4_4_ < 0x4000;
      metaDataBucketLinkedListElement._4_4_ = metaDataBucketLinkedListElement._4_4_ + 1) {
    local_50 = this->m_StaticPointerListHashtable[metaDataBucketLinkedListElement._4_4_];
    if (local_50 != (new_ptr_list_t *)0x0) {
      for (; local_50 != (new_ptr_list_t *)0x0; local_50 = local_50->next) {
        if (verbose) {
          fprintf(pFStack_40,
                  "Static object allocated at 0x%p (size %d[bytes]) allocated in: %s:%d\n",
                  local_50 + 1,local_50->size & 0xffffffff,local_50->file,
                  (ulong)(uint)local_50->line);
        }
        *memCount = *memCount + 1;
        *memSize = local_50->size + *memSize;
      }
    }
  }
  closeFile(this,(FILE *)pFStack_40);
  return;
}

Assistant:

void staticMemAllocation(size_t& memCount, uint64_t& memSize, bool verbose, const char* fileDumperName, bool append) {
        memCount = 0;
        memSize = 0;

        FILE* dumper = NULL;
        if (verbose) {
            dumper = openFile(fileDumperName, append);
        }

        for (int index = 0; index < MEMPLUMBER_HASHTABLE_SIZE; ++index) {
            new_ptr_list_t* metaDataBucketLinkedListElement = m_StaticPointerListHashtable[index];

            // if bucket is empty - continue
            if (metaDataBucketLinkedListElement == NULL) {
                continue;
            }

            // go over all of the elements in the link list in this bucket
            while (metaDataBucketLinkedListElement != NULL) {

                if (verbose) {
                    fprintf(dumper, "Static object allocated at 0x%p (size %d[bytes]) allocated in: %s:%d\n",
                        (char*) metaDataBucketLinkedListElement + sizeof(new_ptr_list_t), 
                        (int) metaDataBucketLinkedListElement->size,
                        metaDataBucketLinkedListElement->file, 
                        metaDataBucketLinkedListElement->line);
                }

                memCount++;
                memSize += (uint64_t)metaDataBucketLinkedListElement->size;

                // go to the next item on the list
                metaDataBucketLinkedListElement = metaDataBucketLinkedListElement->next;
            }
        }

        closeFile(dumper);
    }